

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_Tt7IsopCover(word *uOn,word *uOnDc,int nVars,word *uRes,int *pCover,int *pnCubes)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  int nEnd1;
  int nEnd0;
  int nBeg0;
  int c;
  word uRes2;
  word uRes1;
  word uRes0;
  int *pnCubes_local;
  int *pCover_local;
  word *uRes_local;
  int nVars_local;
  word *uOnDc_local;
  word *uOn_local;
  
  if ((nVars < 7) || ((*uOn == uOn[1] && (*uOnDc == uOnDc[1])))) {
    wVar3 = *uOn;
    wVar4 = *uOnDc;
    iVar2 = Abc_MinInt(nVars,6);
    wVar3 = Abc_Tt6IsopCover(wVar3,wVar4,iVar2,pCover,pnCubes);
    uRes[1] = wVar3;
    *uRes = wVar3;
  }
  else {
    if (nVars != 7) {
      __assert_fail("nVars == 7",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x88f,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
    }
    nEnd0 = *pnCubes;
    wVar3 = Abc_Tt6IsopCover(*uOn & (uOnDc[1] ^ 0xffffffffffffffff),*uOnDc,6,pCover,pnCubes);
    iVar2 = *pnCubes;
    wVar4 = Abc_Tt6IsopCover(uOn[1] & (*uOnDc ^ 0xffffffffffffffff),uOnDc[1],6,pCover,pnCubes);
    iVar1 = *pnCubes;
    wVar5 = Abc_Tt6IsopCover(*uOn & (wVar3 ^ 0xffffffffffffffff) |
                             uOn[1] & (wVar4 ^ 0xffffffffffffffff),*uOnDc & uOnDc[1],6,pCover,
                             pnCubes);
    *uRes = wVar5 | wVar3;
    uRes[1] = wVar5 | wVar4;
    for (; nEnd0 < iVar2; nEnd0 = nEnd0 + 1) {
      pCover[nEnd0] = pCover[nEnd0] | 0x1000;
    }
    while (nEnd0 = iVar2, nEnd0 < iVar1) {
      pCover[nEnd0] = pCover[nEnd0] | 0x2000;
      iVar2 = nEnd0 + 1;
    }
    if (((*uOn & (*uRes ^ 0xffffffffffffffff)) != 0) ||
       ((uOn[1] & (uRes[1] ^ 0xffffffffffffffff)) != 0)) {
      __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x89e,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
    }
    if (((*uRes & (*uOnDc ^ 0xffffffffffffffff)) != 0) ||
       ((uRes[1] & (uOnDc[1] ^ 0xffffffffffffffff)) != 0)) {
      __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x89f,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
    }
  }
  return;
}

Assistant:

static inline void Abc_Tt7IsopCover( word uOn[2], word uOnDc[2], int nVars, word uRes[2], int * pCover, int * pnCubes )
{
    if ( nVars <= 6 || (uOn[0] == uOn[1] && uOnDc[0] == uOnDc[1]) )
        uRes[0] = uRes[1] = Abc_Tt6IsopCover( uOn[0], uOnDc[0], Abc_MinInt(nVars, 6), pCover, pnCubes );
    else
    {
        word uRes0, uRes1, uRes2;
        int c, nBeg0, nEnd0, nEnd1;
        assert( nVars == 7 );
        // solve for cofactors
        nBeg0 = *pnCubes; 
        uRes0 = Abc_Tt6IsopCover( uOn[0] & ~uOnDc[1], uOnDc[0], 6, pCover, pnCubes );   
        nEnd0 = *pnCubes;
        uRes1 = Abc_Tt6IsopCover( uOn[1] & ~uOnDc[0], uOnDc[1], 6, pCover, pnCubes );   
        nEnd1 = *pnCubes;
        uRes2 = Abc_Tt6IsopCover( (uOn[0] & ~uRes0) | (uOn[1] & ~uRes1), uOnDc[0] & uOnDc[1], 6, pCover, pnCubes );
        // derive the final truth table
        uRes[0] = uRes2 | uRes0;
        uRes[1] = uRes2 | uRes1;
        for ( c = nBeg0; c < nEnd0; c++ )
            pCover[c] |= (1 << (2*6+0));
        for ( c = nEnd0; c < nEnd1; c++ )
            pCover[c] |= (1 << (2*6+1));
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 );
    }
}